

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

int strarray_copy(strarray *dst,strarray *src)

{
  size_t __n;
  char *__dest;
  int iVar1;
  ulong __size;
  
  if ((src->value == (char *)0x0) || (src->length == 0)) {
    dst->value = (char *)0x0;
    dst->length = 0;
    iVar1 = 0;
  }
  else {
    __size = src->length + 0x3f & 0xffffffffffffffc0;
    __dest = (char *)realloc(dst->value,__size);
    if (__dest == (char *)0x0) {
      iVar1 = -1;
    }
    else {
      __n = src->length;
      memcpy(__dest,src->value,__n);
      iVar1 = 0;
      memset(__dest + __n,0,__size - __n);
      dst->length = __n;
      dst->value = __dest;
    }
  }
  return iVar1;
}

Assistant:

int
strarray_copy(struct strarray *dst, const struct strarray *src) {
  char *ptr;
  size_t block;
  if (src->value == NULL || src->length == 0) {
    memset(dst, 0, sizeof(*dst));
    return 0;
  }

  block = STRARRAY_MEMSIZE(src->length);
  ptr = realloc(dst->value, block);
  if (!ptr) {
    return -1;
  }

  memcpy(ptr, src->value, src->length);
  memset(ptr + src->length, 0, block - src->length);
  dst->length = src->length;
  dst->value = ptr;
  return 0;
}